

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelHandler::handleSplitMessage(ParallelHandler *this)

{
  bool bVar1;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *ptr;
  ParallelSolve *this_00;
  long in_RDI;
  bool ok;
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  newPath;
  Solver *s;
  LitVec *pLVar2;
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  *in_stack_ffffffffffffffa0;
  Solver *this_01;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffffc0;
  undefined1 local_18 [24];
  
  local_18._8_8_ = *(undefined8 *)(in_RDI + 0x30);
  ptr = (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)operator_new(0x10);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            (in_stack_ffffffffffffffc0);
  pLVar2 = (LitVec *)local_18;
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  ::SingleOwnerPtr((SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
                    *)pLVar2,ptr,Acquire);
  this_01 = (Solver *)local_18._8_8_;
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  ::operator*((SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
               *)0x21e855);
  bVar1 = Solver::split(this_01,pLVar2);
  if (!bVar1) {
    Potassco::fail(-1,"void Clasp::mt::ParallelHandler::handleSplitMessage()",0x34c,"ok",
                   "unexpected call to split",0);
  }
  pLVar2 = *(LitVec **)(in_RDI + 0x28);
  this_00 = (ParallelSolve *)
            SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
            ::release(in_stack_ffffffffffffffa0);
  ParallelSolve::pushWork(this_00,pLVar2);
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  ::~SingleOwnerPtr((SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
                     *)0x21e91a);
  return;
}

Assistant:

void ParallelHandler::handleSplitMessage() {
	assert(solver_ && "ParallelHandler::handleSplitMessage(): not attached!");
	Solver& s = *solver_;
	SingleOwnerPtr<LitVec> newPath(new LitVec());
	bool ok = s.split(*newPath);
	POTASSCO_ASSERT(ok, "unexpected call to split");
	ctrl_->pushWork(newPath.release());
}